

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapequad.cpp
# Opt level: O0

void pzshape::TPZShapeQuad::Shape
               (TPZVec<double> *pt,TPZVec<long> *id,TPZVec<int> *order,TPZFMatrix<double> *phi,
               TPZFMatrix<double> *dphi)

{
  double dVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  uint uVar5;
  double *pdVar6;
  long *plVar7;
  int *piVar8;
  TPZVec<int> *in_RDX;
  TPZVec<long> *in_RSI;
  double dVar9;
  int xj_1;
  int i_1;
  TPZFMatrix<double> dphin;
  TPZFMatrix<double> phin;
  int ord;
  REAL store2 [40];
  REAL store1 [20];
  int xj;
  int i;
  TPZFMatrix<double> dphin_1;
  TPZFMatrix<double> phin_1;
  int ord2;
  REAL store2_1 [40];
  REAL store1_1 [20];
  TPZManVector<double,_1> outvec;
  TPZVec<long> ids;
  int rib;
  int shape;
  REAL out;
  TPZFNMatrix<100,_double> dphiblend;
  TPZFNMatrix<100,_double> phiblend;
  int d;
  int is;
  TPZVec<long> *in_stack_fffffffffffff048;
  TPZManVector<double,_1> *in_stack_fffffffffffff050;
  TPZFMatrix<double> *in_stack_fffffffffffff058;
  _func_int **pp_Var10;
  TPZFMatrix<double> *in_stack_fffffffffffff060;
  TPZFMatrix<double> *in_stack_fffffffffffff068;
  TPZFNMatrix<100,_double> *in_stack_fffffffffffff070;
  int64_t in_stack_fffffffffffff078;
  TPZManVector<double,_1> *in_stack_fffffffffffff080;
  int64_t in_stack_fffffffffffff090;
  double *in_stack_fffffffffffff098;
  int64_t in_stack_fffffffffffff0a0;
  int64_t in_stack_fffffffffffff0a8;
  TPZFMatrix<double> *in_stack_fffffffffffff0b0;
  undefined4 in_stack_fffffffffffff0bc;
  TPZFMatrix<double> *in_stack_fffffffffffff0e0;
  TPZFMatrix<double> *in_stack_fffffffffffff0e8;
  TPZVec<double> *in_stack_fffffffffffff0f0;
  TPZFMatrix<double> *in_stack_fffffffffffff100;
  TPZFMatrix<double> *in_stack_fffffffffffff108;
  double dVar11;
  TPZVec<double> *in_stack_fffffffffffff110;
  int local_e28;
  int local_e24;
  int local_b18;
  int local_b14;
  int in_stack_fffffffffffff674;
  TPZFMatrix<double> *in_stack_fffffffffffff678;
  TPZFMatrix<double> *in_stack_fffffffffffff680;
  int in_stack_fffffffffffff68c;
  TPZVec<double> *in_stack_fffffffffffff690;
  TPZVec<long> local_7e0;
  int local_7c0;
  int local_7bc;
  int local_30;
  int local_2c;
  TPZVec<int> *local_18;
  TPZVec<long> *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  ShapeCorner(in_stack_fffffffffffff0f0,in_stack_fffffffffffff0e8,in_stack_fffffffffffff0e0);
  TPZFNMatrix<100,_double>::TPZFNMatrix
            (in_stack_fffffffffffff070,(int64_t)in_stack_fffffffffffff068,
             (int64_t)in_stack_fffffffffffff060);
  TPZFNMatrix<100,_double>::TPZFNMatrix
            (in_stack_fffffffffffff070,(int64_t)in_stack_fffffffffffff068,
             (int64_t)in_stack_fffffffffffff060);
  for (local_2c = 0; local_2c < 4; local_2c = local_2c + 1) {
    pdVar6 = TPZFMatrix<double>::operator()
                       (&in_stack_fffffffffffff070->super_TPZFMatrix<double>,
                        (int64_t)in_stack_fffffffffffff068,(int64_t)in_stack_fffffffffffff060);
    dVar9 = *pdVar6;
    pdVar6 = TPZFMatrix<double>::operator()
                       (&in_stack_fffffffffffff070->super_TPZFMatrix<double>,
                        (int64_t)in_stack_fffffffffffff068,(int64_t)in_stack_fffffffffffff060);
    *pdVar6 = dVar9;
    for (local_30 = 0; local_30 < 2; local_30 = local_30 + 1) {
      pdVar6 = TPZFMatrix<double>::operator()
                         (&in_stack_fffffffffffff070->super_TPZFMatrix<double>,
                          (int64_t)in_stack_fffffffffffff068,(int64_t)in_stack_fffffffffffff060);
      dVar9 = *pdVar6;
      pdVar6 = TPZFMatrix<double>::operator()
                         (&in_stack_fffffffffffff070->super_TPZFMatrix<double>,
                          (int64_t)in_stack_fffffffffffff068,(int64_t)in_stack_fffffffffffff060);
      *pdVar6 = dVar9;
    }
  }
  ShapeGenerating(in_stack_fffffffffffff110,in_stack_fffffffffffff108,in_stack_fffffffffffff100);
  local_7bc = 4;
  for (local_7c0 = 0; local_7c0 < 4; local_7c0 = local_7c0 + 1) {
    ProjectPoint2dQuadToRib
              ((int)((ulong)in_stack_fffffffffffff070 >> 0x20),
               (TPZVec<double> *)in_stack_fffffffffffff068,(REAL *)in_stack_fffffffffffff060);
    TPZVec<long>::TPZVec
              ((TPZVec<long> *)in_stack_fffffffffffff050,(int64_t)in_stack_fffffffffffff048);
    TPZManVector<double,_1>::TPZManVector
              (in_stack_fffffffffffff080,in_stack_fffffffffffff078,
               (double *)in_stack_fffffffffffff070);
    plVar7 = TPZVec<long>::operator[](local_10,(long)(local_7c0 % 4));
    lVar4 = *plVar7;
    plVar7 = TPZVec<long>::operator[](&local_7e0,0);
    *plVar7 = lVar4;
    uVar5 = local_7c0 + 1U;
    if ((int)(local_7c0 + 1U) < 0) {
      uVar5 = local_7c0 + 4;
    }
    plVar7 = TPZVec<long>::operator[](local_10,(long)(int)((local_7c0 + 1) - (uVar5 & 0xfffffffc)));
    lVar4 = *plVar7;
    plVar7 = TPZVec<long>::operator[](&local_7e0,1);
    *plVar7 = lVar4;
    piVar8 = TPZVec<int>::operator[](local_18,(long)local_7c0);
    iVar2 = *piVar8;
    TPZFMatrix<double>::TPZFMatrix
              (in_stack_fffffffffffff0b0,in_stack_fffffffffffff0a8,in_stack_fffffffffffff0a0,
               in_stack_fffffffffffff098,in_stack_fffffffffffff090);
    TPZFMatrix<double>::TPZFMatrix
              (in_stack_fffffffffffff0b0,in_stack_fffffffffffff0a8,in_stack_fffffffffffff0a0,
               in_stack_fffffffffffff098,in_stack_fffffffffffff090);
    TPZVec<int>::operator[](local_18,(long)local_7c0);
    TPZShapeLinear::GetTransformId1d(in_stack_fffffffffffff048);
    TPZShapeLinear::ShapeInternal
              ((TPZVec<double> *)in_stack_fffffffffffff070,
               (int)((ulong)in_stack_fffffffffffff068 >> 0x20),in_stack_fffffffffffff060,
               in_stack_fffffffffffff058,(int)((ulong)in_stack_fffffffffffff050 >> 0x20));
    TransformDerivativeFromRibToQuad
              ((int)((ulong)in_stack_fffffffffffff070 >> 0x20),(int)in_stack_fffffffffffff070,
               in_stack_fffffffffffff068);
    for (local_b14 = 0; local_b14 < iVar2 + -1; local_b14 = local_b14 + 1) {
      pdVar6 = TPZFMatrix<double>::operator()
                         (&in_stack_fffffffffffff070->super_TPZFMatrix<double>,
                          (int64_t)in_stack_fffffffffffff068,(int64_t)in_stack_fffffffffffff060);
      dVar9 = *pdVar6;
      pdVar6 = TPZFMatrix<double>::operator()
                         (&in_stack_fffffffffffff070->super_TPZFMatrix<double>,
                          (int64_t)in_stack_fffffffffffff068,(int64_t)in_stack_fffffffffffff060);
      dVar11 = *pdVar6;
      pdVar6 = TPZFMatrix<double>::operator()
                         (&in_stack_fffffffffffff070->super_TPZFMatrix<double>,
                          (int64_t)in_stack_fffffffffffff068,(int64_t)in_stack_fffffffffffff060);
      *pdVar6 = dVar9 * dVar11;
      for (local_b18 = 0; local_b18 < 2; local_b18 = local_b18 + 1) {
        pdVar6 = TPZFMatrix<double>::operator()
                           (&in_stack_fffffffffffff070->super_TPZFMatrix<double>,
                            (int64_t)in_stack_fffffffffffff068,(int64_t)in_stack_fffffffffffff060);
        dVar9 = *pdVar6;
        pdVar6 = TPZFMatrix<double>::operator()
                           (&in_stack_fffffffffffff070->super_TPZFMatrix<double>,
                            (int64_t)in_stack_fffffffffffff068,(int64_t)in_stack_fffffffffffff060);
        dVar11 = *pdVar6;
        pdVar6 = TPZFMatrix<double>::operator()
                           (&in_stack_fffffffffffff070->super_TPZFMatrix<double>,
                            (int64_t)in_stack_fffffffffffff068,(int64_t)in_stack_fffffffffffff060);
        dVar1 = *pdVar6;
        pdVar6 = TPZFMatrix<double>::operator()
                           (&in_stack_fffffffffffff070->super_TPZFMatrix<double>,
                            (int64_t)in_stack_fffffffffffff068,(int64_t)in_stack_fffffffffffff060);
        dVar9 = dVar9 * dVar11 + dVar1 * *pdVar6;
        pdVar6 = TPZFMatrix<double>::operator()
                           (&in_stack_fffffffffffff070->super_TPZFMatrix<double>,
                            (int64_t)in_stack_fffffffffffff068,(int64_t)in_stack_fffffffffffff060);
        *pdVar6 = dVar9;
      }
      local_7bc = local_7bc + 1;
    }
    TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)0x188f241);
    TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)0x188f24e);
    TPZManVector<double,_1>::~TPZManVector(in_stack_fffffffffffff050);
    TPZVec<long>::~TPZVec((TPZVec<long> *)in_stack_fffffffffffff050);
  }
  piVar8 = TPZVec<int>::operator[](local_18,4);
  iVar2 = *piVar8;
  piVar8 = TPZVec<int>::operator[](local_18,4);
  iVar3 = *piVar8;
  TPZFMatrix<double>::TPZFMatrix
            (in_stack_fffffffffffff0b0,in_stack_fffffffffffff0a8,in_stack_fffffffffffff0a0,
             in_stack_fffffffffffff098,in_stack_fffffffffffff090);
  TPZFMatrix<double>::TPZFMatrix
            (in_stack_fffffffffffff0b0,in_stack_fffffffffffff0a8,in_stack_fffffffffffff0a0,
             in_stack_fffffffffffff098,in_stack_fffffffffffff090);
  piVar8 = TPZVec<int>::operator[](local_18,4);
  GetTransformId2dQ((TPZVec<long> *)CONCAT44(in_stack_fffffffffffff0bc,*piVar8 + -2));
  ShapeInternal(in_stack_fffffffffffff690,in_stack_fffffffffffff68c,in_stack_fffffffffffff680,
                in_stack_fffffffffffff678,in_stack_fffffffffffff674);
  for (local_e24 = 0; local_e24 < (iVar2 + -1) * (iVar3 + -1); local_e24 = local_e24 + 1) {
    pdVar6 = TPZFMatrix<double>::operator()
                       (&in_stack_fffffffffffff070->super_TPZFMatrix<double>,
                        (int64_t)in_stack_fffffffffffff068,(int64_t)in_stack_fffffffffffff060);
    dVar9 = *pdVar6;
    pdVar6 = TPZFMatrix<double>::operator()
                       (&in_stack_fffffffffffff070->super_TPZFMatrix<double>,
                        (int64_t)in_stack_fffffffffffff068,(int64_t)in_stack_fffffffffffff060);
    dVar9 = dVar9 * *pdVar6;
    pdVar6 = TPZFMatrix<double>::operator()
                       (&in_stack_fffffffffffff070->super_TPZFMatrix<double>,
                        (int64_t)in_stack_fffffffffffff068,(int64_t)in_stack_fffffffffffff060);
    *pdVar6 = dVar9;
    for (local_e28 = 0; local_e28 < 2; local_e28 = local_e28 + 1) {
      pdVar6 = TPZFMatrix<double>::operator()
                         (&in_stack_fffffffffffff070->super_TPZFMatrix<double>,
                          (int64_t)in_stack_fffffffffffff068,(int64_t)in_stack_fffffffffffff060);
      dVar9 = *pdVar6;
      pdVar6 = TPZFMatrix<double>::operator()
                         (&in_stack_fffffffffffff070->super_TPZFMatrix<double>,
                          (int64_t)in_stack_fffffffffffff068,(int64_t)in_stack_fffffffffffff060);
      in_stack_fffffffffffff068 = (TPZFMatrix<double> *)*pdVar6;
      in_stack_fffffffffffff070 =
           (TPZFNMatrix<100,_double> *)
           TPZFMatrix<double>::operator()
                     (&in_stack_fffffffffffff070->super_TPZFMatrix<double>,
                      (int64_t)in_stack_fffffffffffff068,(int64_t)in_stack_fffffffffffff060);
      pp_Var10 = (in_stack_fffffffffffff070->super_TPZFMatrix<double>).super_TPZMatrix<double>.
                 super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable;
      in_stack_fffffffffffff060 =
           (TPZFMatrix<double> *)
           TPZFMatrix<double>::operator()
                     ((TPZFMatrix<double> *)in_stack_fffffffffffff070,
                      (int64_t)in_stack_fffffffffffff068,(int64_t)in_stack_fffffffffffff060);
      dVar9 = dVar9 * (double)in_stack_fffffffffffff068 +
              (double)pp_Var10 *
              (double)(in_stack_fffffffffffff060->super_TPZMatrix<double>).super_TPZBaseMatrix.
                      super_TPZSavable._vptr_TPZSavable;
      pdVar6 = TPZFMatrix<double>::operator()
                         (&in_stack_fffffffffffff070->super_TPZFMatrix<double>,
                          (int64_t)in_stack_fffffffffffff068,(int64_t)in_stack_fffffffffffff060);
      *pdVar6 = dVar9;
    }
    local_7bc = local_7bc + 1;
  }
  TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)0x188f637);
  TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)0x188f644);
  TPZFNMatrix<100,_double>::~TPZFNMatrix((TPZFNMatrix<100,_double> *)0x188f651);
  TPZFNMatrix<100,_double>::~TPZFNMatrix((TPZFNMatrix<100,_double> *)0x188f65e);
  return;
}

Assistant:

void TPZShapeQuad::Shape(TPZVec<REAL> &pt, TPZVec<int64_t> &id, TPZVec<int> &order,
                             TPZFMatrix<REAL> &phi,TPZFMatrix<REAL> &dphi) {
        ShapeCorner(pt,phi,dphi);
        int is,d;
        TPZFNMatrix<100> phiblend(NSides,1),dphiblend(Dimension,NSides);
        for(is=0; is<NCornerNodes; is++)
        {
            phiblend(is,0) = phi(is,0);
            for(d=0; d<Dimension; d++)
            {
                dphiblend(d,is) = dphi(d,is);
            }
        }
        ShapeGenerating(pt,phiblend,dphiblend);
        REAL out;
        int shape = 4;
        for (int rib = 0; rib < 4; rib++) {
            
            ProjectPoint2dQuadToRib(rib,pt,out);
            TPZVec<int64_t> ids(2);
            TPZManVector<REAL,1> outvec(1,out);
            ids[0] = id[rib%4];
            ids[1] = id[(rib+1)%4];
            REAL store1[20],store2[40];
            int ord2 = order[rib]-1;//two orders : order in x and order in y
            TPZFMatrix<REAL> phin(ord2,1,store1,20),dphin(2,ord2,store2,40);
            TPZShapeLinear::ShapeInternal(outvec,order[rib],phin,dphin,TPZShapeLinear::GetTransformId1d(ids));
            TransformDerivativeFromRibToQuad(rib,ord2,dphin);
            for (int i = 0; i < ord2; i++) {
                phi(shape,0) = phiblend(rib+4,0)*phin(i,0);
                for(int xj=0;xj<2;xj++) {
                    dphi(xj,shape) = dphiblend(xj,rib+4)*phin(i,0)+
                    phiblend(rib+4,0)*dphin(xj,i);
                }
                shape++;
            }
        }
        REAL store1[20],store2[40];
        int ord = (order[4]-1)*(order[4]-1);
        TPZFMatrix<REAL> phin(ord,1,store1,20),dphin(2,ord,store2,40);
        ShapeInternal(pt,order[4]-2,phin,dphin,GetTransformId2dQ(id));
        for(int i=0;i<ord;i++)    {//funcoes de interior s�o em numero ordem-1
            phi(shape,0) = phiblend(8,0)*phin(i,0);
            for(int xj=0;xj<2;xj++) {//x e y
                dphi(xj,shape) = dphiblend(xj,8)*phin(i,0) +
                phiblend(8,0)*dphin(xj,i);
            }
            shape++;
        }
    }